

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O1

void __thiscall
OpenGLFrameBuffer::GetScreenshotBuffer
          (OpenGLFrameBuffer *this,BYTE **buffer,int *pitch,ESSType *color_type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  FGLRenderer *pFVar5;
  BYTE *pBVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  TArray<unsigned_char,_unsigned_char> pixels;
  TArray<unsigned_char,_unsigned_char> local_48;
  BYTE **local_38;
  
  pFVar5 = GLRenderer;
  local_48.Array = (uchar *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_38 = buffer;
  TArray<unsigned_char,_unsigned_char>::Resize
            (&local_48,
             (GLRenderer->mOutputLetterbox).width * (GLRenderer->mOutputLetterbox).height * 3);
  (*_ptrc_glPixelStorei)(0xd05,1);
  (*_ptrc_glReadPixels)
            ((pFVar5->mOutputLetterbox).left,(pFVar5->mOutputLetterbox).top,
             (pFVar5->mOutputLetterbox).width,(pFVar5->mOutputLetterbox).height,0x1907,0x1401,
             local_48.Array);
  (*_ptrc_glPixelStorei)(0xd05,4);
  uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  uVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  (*(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.super_DObject.
    _vptr_DObject[0x17])(this);
  pBVar6 = (BYTE *)operator_new__((long)(int)(uVar2 * uVar1 * 3));
  this->ScreenshotBuffer = pBVar6;
  if (0 < (int)uVar2) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar10 = 0;
        lVar9 = lVar7;
        do {
          iVar3 = (pFVar5->mOutputLetterbox).width;
          lVar4 = (long)((int)((float)(pFVar5->mOutputLetterbox).height * ((float)(int)uVar8 + 0.5)
                              * (1.0 / (float)(int)uVar2)) * iVar3 +
                        (int)((float)iVar3 * ((float)(int)uVar10 + 0.5) * (1.0 / (float)(int)uVar1))
                        ) * 3;
          this->ScreenshotBuffer[lVar9] = local_48.Array[lVar4];
          this->ScreenshotBuffer[lVar9 + 1] = local_48.Array[lVar4 + 1];
          this->ScreenshotBuffer[lVar9 + 2] = local_48.Array[lVar4 + 2];
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 3;
        } while (uVar1 != uVar10);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + (ulong)uVar1 * 3;
    } while (uVar8 != uVar2);
  }
  *pitch = uVar1 * -3;
  *color_type = SS_RGB;
  *local_38 = this->ScreenshotBuffer + (int)((uVar2 - 1) * uVar1 * 3);
  TArray<unsigned_char,_unsigned_char>::~TArray(&local_48);
  return;
}

Assistant:

void OpenGLFrameBuffer::GetScreenshotBuffer(const BYTE *&buffer, int &pitch, ESSType &color_type)
{
	const auto &viewport = GLRenderer->mOutputLetterbox;

	// Grab what is in the back buffer.
	// We cannot rely on SCREENWIDTH/HEIGHT here because the output may have been scaled.
	TArray<uint8_t> pixels;
	pixels.Resize(viewport.width * viewport.height * 3);
	glPixelStorei(GL_PACK_ALIGNMENT, 1);
	glReadPixels(viewport.left, viewport.top, viewport.width, viewport.height, GL_RGB, GL_UNSIGNED_BYTE, &pixels[0]);
	glPixelStorei(GL_PACK_ALIGNMENT, 4);

	// Copy to screenshot buffer:
	int w = SCREENWIDTH;
	int h = SCREENHEIGHT;

	ReleaseScreenshotBuffer();
	ScreenshotBuffer = new BYTE[w * h * 3];

	float rcpWidth = 1.0f / w;
	float rcpHeight = 1.0f / h;
	for (int y = 0; y < h; y++)
	{
		for (int x = 0; x < w; x++)
		{
			float u = (x + 0.5f) * rcpWidth;
			float v = (y + 0.5f) * rcpHeight;
			int sx = u * viewport.width;
			int sy = v * viewport.height;
			int sindex = (sx + sy * viewport.width) * 3;
			int dindex = (x + y * w) * 3;
			ScreenshotBuffer[dindex] = pixels[sindex];
			ScreenshotBuffer[dindex + 1] = pixels[sindex + 1];
			ScreenshotBuffer[dindex + 2] = pixels[sindex + 2];
		}
	}

	pitch = -w*3;
	color_type = SS_RGB;
	buffer = ScreenshotBuffer + w * 3 * (h - 1);
}